

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

string * QuestSerialize_abi_cxx11_
                   (string *__return_storage_ptr__,
                   map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
                   *list,set<Character_QuestState,_std::less<Character_QuestState>,_std::allocator<Character_QuestState>_>
                         *list_inactive)

{
  _Rb_tree_header *p_Var1;
  short sVar2;
  Quest *this;
  _Rb_tree_node_base *p_Var3;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  int subject;
  int subject_00;
  pair<const_short,_std::shared_ptr<Quest_Context>_> quest;
  Character_QuestState state;
  undefined1 local_98 [32];
  Character_QuestState local_78;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var1 = &(list->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var3 = (list->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    std::pair<const_short,_std::shared_ptr<Quest_Context>_>::pair
              ((pair<const_short,_std::shared_ptr<Quest_Context>_> *)local_98,
               (pair<const_short,_std::shared_ptr<Quest_Context>_> *)(p_Var3 + 1));
    if ((Quest_Context *)local_98._8_8_ != (Quest_Context *)0x0) {
      this = Quest_Context::GetQuest((Quest_Context *)local_98._8_8_);
      sVar2 = Quest::ID(this);
      util::to_string_abi_cxx11_((string *)&local_78,(util *)(ulong)(uint)(int)sVar2,subject);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      EOPlus::Context::StateName_abi_cxx11_((string *)&local_78,(Context *)local_98._8_8_);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      Quest_Context::SerializeProgress_abi_cxx11_
                ((string *)&local_78,(Quest_Context *)local_98._8_8_);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 0x10));
  }
  for (p_Var5 = (list_inactive->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(list_inactive->_M_t)._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    Character_QuestState::Character_QuestState(&local_78,(Character_QuestState *)(p_Var5 + 1));
    cVar4 = std::
            _Rb_tree<short,_std::pair<const_short,_std::shared_ptr<Quest_Context>_>,_std::_Select1st<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
            ::find(&list->_M_t,&local_78.quest_id);
    if ((_Rb_tree_header *)cVar4._M_node == p_Var1) {
      util::to_string_abi_cxx11_
                ((string *)local_98,(util *)(ulong)(uint)(int)local_78.quest_id,subject_00);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    Character_QuestState::~Character_QuestState(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string QuestSerialize(const std::map<short, std::shared_ptr<Quest_Context>>& list, const std::set<Character_QuestState>& list_inactive)
{
	std::string serialized;

	UTIL_FOREACH(list, quest)
	{
		if (!quest.second)
			continue;

		serialized.append(util::to_string(quest.second->GetQuest()->ID()));
		serialized.append(",");
		serialized.append(quest.second->StateName());
		serialized.append(",");
		serialized.append(quest.second->SerializeProgress());
		serialized.append(";");
	}

	UTIL_FOREACH(list_inactive, state)
	{
		if (list.find(state.quest_id) != list.end())
		{
#ifdef DEBUG
			Console::Dbg("Discarding inactive quest save as the quest was restarted: %i", state.quest_id);
#endif // DEBUG
			continue;
		}

		serialized.append(util::to_string(state.quest_id));
		serialized.append(",");
		serialized.append(state.quest_state);
		serialized.append(",");
		serialized.append(state.quest_progress);
		serialized.append(";");
	}

	return serialized;
}